

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  Player *this;
  Player *this_00;
  Printer local_6b;
  Player *pPStack_68;
  Printer printer;
  Player *p2;
  Player *p1;
  Board board;
  int n;
  char **argv_local;
  int argc_local;
  
  board._36_4_ = 9;
  Board::Board((Board *)&p1,9);
  this = (Player *)operator_new(0x20);
  Player::Player(this);
  this_00 = (Player *)operator_new(0x20);
  Player::Player(this_00);
  pPStack_68 = this_00;
  Printer::Printer(&local_6b,'.','x','o');
  Board::playAt((Board *)&p1,0,0,this);
  Board::playAt((Board *)&p1,4,5,pPStack_68);
  Board::playAt((Board *)&p1,6,7,this);
  Printer::printBoard(&local_6b,(Board *)&p1,this);
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  Board::removeStone((Board *)&p1,0,0);
  Printer::printBoard(&local_6b,(Board *)&p1,this);
  if (this != (Player *)0x0) {
    Player::~Player(this);
    operator_delete(this);
  }
  Printer::~Printer(&local_6b);
  Board::~Board((Board *)&p1);
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{
    // dummy client code for demonstration so far

    int n = 9;
    Board board = Board(n);


    Player *p1 = new Player(),
        *p2 = new Player();
    Printer printer = Printer();


    board.playAt(0,0, p1);
    board.playAt(4,5, p2);
    board.playAt(6,7, p1);


    printer.printBoard(board, p1);
    cout << endl; cout << endl;


    board.removeStone(0,0);
    printer.printBoard(board, p1);

    delete p1, p2;
    return 0;
}